

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# whisper.cpp
# Opt level: O3

whisper_context *
whisper_init_from_file_with_params_no_state(char *path_model,whisper_context_params params)

{
  char *pcVar1;
  whisper_context *pwVar2;
  ifstream fin;
  whisper_model_loader local_248;
  long local_228 [4];
  byte abStack_208 [488];
  
  whisper_log_internal
            (GGML_LOG_LEVEL_INFO,"%s: loading model from \'%s\'\n",
             "whisper_init_from_file_with_params_no_state",path_model);
  std::ifstream::ifstream(local_228,path_model,_S_bin);
  if ((abStack_208[*(long *)(local_228[0] + -0x18)] & 5) == 0) {
    local_248.read = whisper_init_from_file_with_params_no_state::anon_class_1_0_00000001::__invoke;
    local_248.eof = whisper_init_from_file_with_params_no_state::anon_class_1_0_00000001::__invoke;
    local_248.close = whisper_init_from_file_with_params_no_state::anon_class_1_0_00000001::__invoke
    ;
    local_248.context = local_228;
    pwVar2 = whisper_init_with_params_no_state(&local_248,params);
    if (pwVar2 != (whisper_context *)0x0) {
      pcVar1 = (char *)(pwVar2->path_model)._M_string_length;
      strlen(path_model);
      std::__cxx11::string::_M_replace((ulong)&pwVar2->path_model,0,pcVar1,(ulong)path_model);
    }
  }
  else {
    pwVar2 = (whisper_context *)0x0;
    whisper_log_internal
              (GGML_LOG_LEVEL_ERROR,"%s: failed to open \'%s\'\n",
               "whisper_init_from_file_with_params_no_state",path_model);
  }
  std::ifstream::~ifstream(local_228);
  return pwVar2;
}

Assistant:

struct whisper_context * whisper_init_from_file_with_params_no_state(const char * path_model, struct whisper_context_params params) {
    WHISPER_LOG_INFO("%s: loading model from '%s'\n", __func__, path_model);
#ifdef _MSC_VER
    // Convert UTF-8 path to wide string (UTF-16) for Windows, resolving character encoding issues.
    std::wstring_convert<std::codecvt_utf8<wchar_t>> converter;
    std::wstring path_model_wide = converter.from_bytes(path_model);
    auto fin = std::ifstream(path_model_wide, std::ios::binary);
#else
    auto fin = std::ifstream(path_model, std::ios::binary);
#endif
    if (!fin) {
        WHISPER_LOG_ERROR("%s: failed to open '%s'\n", __func__, path_model);
        return nullptr;
    }

    whisper_model_loader loader = {};

    loader.context = &fin;

    loader.read = [](void * ctx, void * output, size_t read_size) {
        std::ifstream * fin = (std::ifstream*)ctx;
        fin->read((char *)output, read_size);
        return read_size;
    };

    loader.eof = [](void * ctx) {
        std::ifstream * fin = (std::ifstream*)ctx;
        return fin->eof();
    };

    loader.close = [](void * ctx) {
        std::ifstream * fin = (std::ifstream*)ctx;
        fin->close();
    };

    auto ctx = whisper_init_with_params_no_state(&loader, params);

    if (ctx) {
        ctx->path_model = path_model;
    }

    return ctx;
}